

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void skip_utf8_bom_should_not_skip_bom_if_not_at_beginning(void)

{
  parse_buffer *ppVar1;
  long in_FS_OFFSET;
  uchar string [7];
  parse_buffer local_48;
  uchar local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.content = local_10;
  builtin_memcpy(local_10," \xfeff{}",7);
  local_48.depth = 0;
  local_48.length = 7;
  local_48.hooks.allocate = global_hooks.allocate;
  local_48.hooks.deallocate = global_hooks.deallocate;
  local_48.hooks.reallocate = global_hooks.reallocate;
  local_48.offset = 1;
  ppVar1 = skip_utf8_bom(&local_48);
  if (ppVar1 != (parse_buffer *)0x0) {
    UnityFail(" Expected NULL",0x222);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void skip_utf8_bom_should_not_skip_bom_if_not_at_beginning(void)
{
    const unsigned char string[] = " \xEF\xBB\xBF{}";
    parse_buffer buffer = {0, 0, 0, 0, {0, 0, 0}};
    buffer.content = string;
    buffer.length = sizeof(string);
    buffer.hooks = global_hooks;
    buffer.offset = 1;

    TEST_ASSERT_NULL(skip_utf8_bom(&buffer));
}